

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O3

void __thiscall lunasvg::parseInlineStyle(lunasvg *this,string_view input,SVGElement *element)

{
  byte bVar1;
  byte *pbVar2;
  PropertyID id;
  byte *pbVar3;
  lunasvg *plVar4;
  ulong uVar5;
  byte *pbVar6;
  lunasvg *plVar7;
  string value;
  string name;
  string_view local_90;
  string local_80;
  char *local_60;
  size_t local_58;
  char local_50;
  undefined7 uStack_4f;
  string_view local_40;
  
  local_58 = 0;
  local_50 = '\0';
  local_90._M_len = (size_t)this;
  pbVar6 = (byte *)input._M_len;
  local_60 = &local_50;
  if (this != (lunasvg *)0x0) {
    plVar4 = this + -1;
    local_90._M_str = (char *)input._M_len;
    local_90._M_len = (size_t)this;
    do {
      plVar7 = plVar4;
      pbVar6 = (byte *)local_90._M_str + 1;
      if ((0x20 < (ulong)(byte)*local_90._M_str) ||
         ((0x100002600U >> ((ulong)(byte)*local_90._M_str & 0x3f) & 1) == 0)) {
        goto LAB_0011be30;
      }
      plVar4 = plVar7 + -1;
      local_90._M_str = (char *)pbVar6;
      local_90._M_len = (size_t)plVar7;
    } while (plVar7 != (lunasvg *)0x0);
  }
LAB_0011bdfb:
  local_90._M_str = (char *)pbVar6;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
LAB_0011be30:
  bVar1 = *local_90._M_str;
  if (((0x19 < (int)(char)(bVar1 & 0xdf) - 0x41U) && (bVar1 != 0x5f)) &&
     (pbVar6 = (byte *)local_90._M_str, bVar1 != 0x2d)) goto LAB_0011bdfb;
  local_58 = 0;
  *local_60 = '\0';
  std::__cxx11::string::push_back((char)&local_60);
  while( true ) {
    pbVar6 = (byte *)(local_90._M_str + 1);
    local_90._M_len = local_90._M_len + -1;
    if ((lunasvg *)local_90._M_len == (lunasvg *)0x0) goto LAB_0011bdfb;
    bVar1 = *pbVar6;
    if (((0x19 < ((int)(char)bVar1 & 0xffffffdfU) - 0x41) && (bVar1 != 0x2d)) &&
       ((bVar1 != 0x5f && (9 < (int)(char)bVar1 - 0x30U)))) break;
    local_90._M_str = (char *)pbVar6;
    std::__cxx11::string::push_back((char)&local_60);
  }
  pbVar2 = (byte *)(local_90._M_str + 2);
  local_90._M_str = (char *)pbVar6;
  while( true ) {
    pbVar3 = pbVar2;
    plVar4 = (lunasvg *)(local_90._M_len + -1);
    uVar5 = (ulong)pbVar3[-1];
    pbVar6 = (byte *)local_90._M_str;
    if (0x3a < uVar5) goto LAB_0011bdfb;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
    pbVar2 = pbVar3 + 1;
    local_90._M_len = (size_t)plVar4;
    pbVar6 = pbVar3;
    local_90._M_str = (char *)pbVar3;
    if (plVar4 == (lunasvg *)0x0) goto LAB_0011bdfb;
  }
  if (uVar5 != 0x3a) goto LAB_0011bdfb;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_90._M_len = (size_t)plVar4;
  for (local_90._M_str = (char *)pbVar3;
      ((lunasvg *)local_90._M_len != (lunasvg *)0x0 && (*local_90._M_str != 0x3b));
      local_90._M_str = local_90._M_str + 1) {
    std::__cxx11::string::push_back((char)&local_80);
    local_90._M_len = local_90._M_len + -1;
  }
  local_40._M_len = local_58;
  local_40._M_str = local_60;
  id = csspropertyid(&local_40);
  if (id != Unknown) {
    SVGElement::setAttribute((SVGElement *)input._M_str,0x100,id,&local_80);
  }
  skipOptionalSpacesOrDelimiter(&local_90,';');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  pbVar6 = (byte *)local_90._M_str;
  if ((lunasvg *)local_90._M_len == (lunasvg *)0x0) goto LAB_0011bdfb;
  goto LAB_0011be30;
}

Assistant:

inline void parseInlineStyle(std::string_view input, SVGElement* element)
{
    std::string name;
    skipOptionalSpaces(input);
    while(readCSSIdentifier(input, name)) {
        skipOptionalSpaces(input);
        if(!skipDelimiter(input, ':'))
            return;
        std::string value;
        while(!input.empty() && input.front() != ';') {
            value.push_back(input.front());
            input.remove_prefix(1);
        }

        auto id = csspropertyid(name);
        if(id != PropertyID::Unknown)
            element->setAttribute(0x100, id, value);
        skipOptionalSpacesOrDelimiter(input, ';');
    }
}